

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  byte bVar2;
  stbi_uc asVar3 [4];
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  uint x_00;
  uint uVar7;
  uint uVar8;
  int iVar9;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  byte *pbVar12;
  char *pcVar13;
  uchar *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint *puVar19;
  undefined4 uVar20;
  undefined7 uVar21;
  uint *data;
  char cVar22;
  undefined4 uVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  stbi_uc local_8c [4];
  uint *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint *local_70;
  undefined4 local_68;
  undefined4 local_64;
  uint local_60;
  undefined4 local_5c;
  ulong local_58;
  stbi_uc *local_50;
  ulong local_48;
  stbi_uc *local_40;
  uint local_34;
  
  pbVar12 = s->img_buffer;
  if (pbVar12 < s->img_buffer_end) {
LAB_0014b1c4:
    s->img_buffer = pbVar12 + 1;
    local_48 = CONCAT44(local_48._4_4_,(uint)*pbVar12);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      pbVar12 = s->img_buffer;
      goto LAB_0014b1c4;
    }
    local_48 = local_48 & 0xffffffff00000000;
  }
  psVar10 = s->img_buffer;
  local_88 = (uint *)y;
  local_70 = (uint *)x;
  local_34 = req_comp;
  if (psVar10 < s->img_buffer_end) {
LAB_0014b252:
    s->img_buffer = psVar10 + 1;
    uVar16 = CONCAT71((int7)((ulong)x >> 8),*psVar10 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      psVar10 = s->img_buffer;
      goto LAB_0014b252;
    }
    uVar16 = 0;
  }
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
LAB_0014b2d7:
    s->img_buffer = psVar10 + 1;
    local_74 = (uint)CONCAT71((int7)((ulong)psVar10 >> 8),*psVar10);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      psVar10 = s->img_buffer;
      goto LAB_0014b2d7;
    }
    local_74 = 0;
  }
  uVar6 = stbi__get16le(s);
  local_60 = stbi__get16le(s);
  pbVar12 = s->img_buffer;
  local_7c = uVar6;
  if (pbVar12 < s->img_buffer_end) {
LAB_0014b36f:
    s->img_buffer = pbVar12 + 1;
    uVar6 = (uint)*pbVar12;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      pbVar12 = s->img_buffer;
      goto LAB_0014b36f;
    }
    uVar6 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar7 = stbi__get16le(s);
  uVar24 = (ulong)uVar7;
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
LAB_0014b423:
    s->img_buffer = psVar10 + 1;
    local_78 = (uint)CONCAT71((int7)((ulong)psVar10 >> 8),*psVar10);
  }
  else {
    if (s->read_from_callbacks != 0) {
      y = (int *)(uVar16 & 0xffffffff);
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      psVar10 = s->img_buffer;
      uVar16 = uVar16 & 0xffffffff;
      goto LAB_0014b423;
    }
    local_78 = 0;
  }
  pbVar12 = s->img_buffer;
  if (pbVar12 < s->img_buffer_end) {
LAB_0014b4ae:
    s->img_buffer = pbVar12 + 1;
    bVar26 = (*pbVar12 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      y = (int *)(uVar16 & 0xffffffff);
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      pbVar12 = s->img_buffer;
      goto LAB_0014b4ae;
    }
    bVar26 = true;
  }
  uVar23 = (undefined4)uVar16;
  local_8c[0] = '\0';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  cVar22 = (char)uVar16;
  uVar21 = (undefined7)((ulong)y >> 8);
  if (cVar22 == '\0') {
    uVar6 = local_78 & 0xff;
    if ((local_78 & 0xff) < 0x10) {
      if ((local_78 & 0xff) != 8) {
        if (uVar6 == 0xf) goto LAB_0014b544;
        goto LAB_0014b565;
      }
LAB_0014b55c:
      uVar6 = 1;
    }
    else if ((uVar6 == 0x20) || (uVar6 == 0x18)) {
      uVar6 = local_78 >> 3 & 0x1f;
    }
    else {
      if (uVar6 != 0x10) goto LAB_0014b565;
      uVar6 = (local_74 & 0xff) - 8;
      if ((byte)local_74 < 8) {
        uVar6 = local_74 & 0xff;
      }
      if (uVar6 != 3) goto LAB_0014b544;
      uVar6 = uVar6 == 3 ^ 3;
    }
LAB_0014b561:
    uVar20 = (undefined4)CONCAT71(uVar21,1);
    local_5c = 0;
  }
  else {
    if (uVar6 < 0x18) {
      if (uVar6 - 0xf < 2) {
LAB_0014b544:
        uVar6 = 3;
        local_5c = 1;
        uVar20 = 0;
        goto LAB_0014b569;
      }
      if (uVar6 == 8) goto LAB_0014b55c;
    }
    else if ((uVar6 == 0x18) || (uVar6 == 0x20)) {
      uVar6 = uVar6 >> 3;
      goto LAB_0014b561;
    }
LAB_0014b565:
    uVar20 = (undefined4)CONCAT71(uVar21,1);
    local_5c = 0;
    uVar6 = 0;
  }
LAB_0014b569:
  if (uVar6 == 0) {
    pcVar13 = "bad format";
    goto LAB_0014bacf;
  }
  *local_70 = x_00;
  *local_88 = uVar7;
  if (comp != (int *)0x0) {
    *comp = uVar6;
  }
  iVar5 = stbi__mad3sizes_valid(x_00,uVar7,uVar6,0);
  if (iVar5 == 0) {
    pcVar13 = "too large";
    goto LAB_0014bacf;
  }
  local_70 = (uint *)stbi__malloc_mad3(x_00,uVar7,uVar6,0);
  if (local_70 == (uint *)0x0) {
LAB_0014bac8:
    pcVar13 = "outofmem";
LAB_0014bacf:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar13;
    return (void *)0x0;
  }
  bVar25 = (byte)local_74 < 8;
  stbi__skip(s,(int)local_48);
  data = local_70;
  local_58 = uVar24;
  if ((cVar22 == '\0' && (char)local_5c == '\0') && bVar25) {
    local_88 = (uint *)CONCAT44(local_88._4_4_,uVar6);
    if (uVar7 != 0) {
      uVar17 = 0;
      do {
        uVar7 = uVar7 - 1;
        uVar8 = uVar17;
        if (bVar26) {
          uVar8 = uVar7;
        }
        stbi__getn(s,(stbi_uc *)((long)data + (long)(int)(uVar8 * uVar6 * x_00)),uVar6 * x_00);
        uVar17 = uVar17 + 1;
      } while (uVar7 != 0);
    }
    goto LAB_0014ba52;
  }
  local_68 = uVar20;
  local_64 = uVar23;
  if (cVar22 == '\0') {
    local_88 = (uint *)CONCAT44(local_88._4_4_,uVar6);
    local_50 = (stbi_uc *)0x0;
  }
  else {
    stbi__skip(s,local_7c);
    uVar17 = local_60;
    psVar10 = (stbi_uc *)stbi__malloc_mad2(local_60,uVar6,0);
    if (psVar10 == (stbi_uc *)0x0) {
      free(local_70);
      goto LAB_0014bac8;
    }
    local_50 = psVar10;
    if ((char)uVar20 == '\0') {
      local_88 = (uint *)CONCAT44(local_88._4_4_,uVar6);
      if (uVar17 != 0) {
        psVar10 = psVar10 + 2;
        do {
          uVar7 = stbi__get16le(s);
          psVar10[-2] = (stbi_uc)((ulong)((uVar7 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          psVar10[-1] = (stbi_uc)((ulong)((uVar7 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          *psVar10 = (stbi_uc)((ulong)((uVar7 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          psVar10 = psVar10 + uVar6;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
        uVar7 = (uint)local_58;
      }
    }
    else {
      iVar5 = stbi__getn(s,psVar10,uVar6 * uVar17);
      if (iVar5 == 0) {
        free(local_70);
        free(psVar10);
        pcVar13 = "bad palette";
        goto LAB_0014bacf;
      }
      local_88 = (uint *)CONCAT44(local_88._4_4_,uVar6);
    }
  }
  if (uVar7 * x_00 != 0) {
    psVar10 = s->buffer_start;
    uVar24 = (ulong)((uint)local_88 + ((uint)local_88 == 0));
    local_40 = s->buffer_start + 1;
    local_48 = (ulong)(uVar7 * x_00);
    uVar16 = 0;
    bVar2 = 0;
    local_7c = 0;
    iVar5 = 0;
    do {
      if ((byte)local_74 < 8) {
LAB_0014b7ce:
        bVar25 = false;
      }
      else {
        if (iVar5 == 0) {
          pbVar12 = s->img_buffer;
          if (pbVar12 < s->img_buffer_end) {
LAB_0014b7af:
            s->img_buffer = pbVar12 + 1;
            local_7c = (uint)*pbVar12;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
              if (iVar5 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar10;
                s->img_buffer_end = local_40;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar10;
                s->img_buffer_end = psVar10 + iVar5;
              }
              pbVar12 = s->img_buffer;
              goto LAB_0014b7af;
            }
            local_7c = 0;
          }
          iVar5 = (local_7c & 0x7f) + 1;
          local_7c = local_7c >> 7;
          goto LAB_0014b7ce;
        }
        bVar25 = (bool)(bVar2 & local_7c != 0);
        local_7c = (uint)(local_7c != 0);
      }
      uVar6 = local_60;
      if (!bVar25) {
        if ((char)local_64 == '\0') {
          if ((char)local_68 == '\0') {
            uVar6 = stbi__get16le(s);
            asVar3 = local_8c;
            local_8c[1] = (char)((ulong)((uVar6 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_8c[0] = (char)((ulong)((uVar6 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_8c[3] = asVar3[3];
            local_8c[2] = (char)((ulong)((uVar6 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          }
          else {
            uVar15 = 0;
            do {
              psVar11 = s->img_buffer;
              if (psVar11 < s->img_buffer_end) {
LAB_0014b8b3:
                s->img_buffer = psVar11 + 1;
                sVar4 = *psVar11;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
                  if (iVar9 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = local_40;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar9;
                  }
                  psVar11 = s->img_buffer;
                  goto LAB_0014b8b3;
                }
                sVar4 = '\0';
              }
              local_8c[uVar15] = sVar4;
              uVar15 = uVar15 + 1;
            } while (uVar24 != uVar15);
          }
        }
        else {
          if ((char)local_78 == '\b') {
            pbVar12 = s->img_buffer;
            if (s->img_buffer_end <= pbVar12) {
              if (s->read_from_callbacks == 0) {
                uVar7 = 0;
                goto LAB_0014b980;
              }
              iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
              if (iVar9 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar10;
                s->img_buffer_end = local_40;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar10;
                s->img_buffer_end = psVar10 + iVar9;
              }
              pbVar12 = s->img_buffer;
            }
            s->img_buffer = pbVar12 + 1;
            uVar7 = (uint)*pbVar12;
          }
          else {
            uVar7 = stbi__get16le(s);
            uVar6 = local_60;
          }
LAB_0014b980:
          if (uVar6 <= uVar7) {
            uVar7 = 0;
          }
          memcpy(local_8c,local_50 + uVar7 * (uint)local_88,uVar24);
        }
      }
      memcpy((uchar *)((long)local_70 + (ulong)((uint)local_88 * (int)uVar16)),local_8c,uVar24);
      iVar5 = iVar5 + -1;
      uVar16 = uVar16 + 1;
      bVar2 = 1;
    } while (uVar16 != local_48);
  }
  data = local_70;
  if (bVar26 && (int)local_58 != 0) {
    iVar5 = (uint)local_88 * x_00;
    uVar7 = (int)local_58 - 1;
    iVar9 = iVar5 * uVar7;
    uVar17 = 0;
    uVar6 = 0;
    do {
      if (x_00 != 0) {
        puVar19 = local_70;
        iVar18 = iVar5 + 1;
        do {
          uVar1 = *(uchar *)((long)puVar19 + (ulong)uVar17);
          *(uchar *)((long)puVar19 + (ulong)uVar17) = *(uchar *)((long)puVar19 + (long)iVar9);
          *(uchar *)((long)puVar19 + (long)iVar9) = uVar1;
          puVar19 = (uint *)((long)puVar19 + 1);
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      }
      iVar9 = iVar9 - iVar5;
      uVar17 = uVar17 + iVar5;
      bVar26 = uVar6 != uVar7 >> 1;
      uVar6 = uVar6 + 1;
    } while (bVar26);
  }
  if (local_50 != (stbi_uc *)0x0) {
    free(local_50);
  }
LAB_0014ba52:
  if (((char)local_5c == '\0' && 2 < (uint)local_88) && (iVar5 = (uint)local_58 * x_00, iVar5 != 0))
  {
    puVar14 = (uchar *)((long)data + 2);
    do {
      uVar1 = puVar14[-2];
      puVar14[-2] = *puVar14;
      *puVar14 = uVar1;
      puVar14 = puVar14 + ((ulong)local_88 & 0xffffffff);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (local_34 == 0) {
    return (uchar *)data;
  }
  if ((uint)local_88 == local_34) {
    return (uchar *)data;
  }
  puVar14 = stbi__convert_format((uchar *)data,(uint)local_88,local_34,x_00,(uint)local_58);
  return puVar14;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}